

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::Operation::execute(Operation *this,Thread *t)

{
  pointer pSVar1;
  pointer pSVar2;
  bool bVar3;
  Result RVar4;
  GLenum GVar5;
  EGLThread *thread;
  bool bVar6;
  long lVar7;
  int depNdx;
  long lVar8;
  EGLThread *eglThread;
  undefined1 local_1c8 [24];
  ostream local_1b0;
  
  thread = (EGLThread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (thread == (EGLThread *)0x0) {
    __cxa_bad_cast();
  }
  bVar6 = true;
  lVar7 = 0;
  for (lVar8 = 0;
      pSVar1 = (this->super_Operation).m_deps.
               super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar8 < (int)((ulong)((long)(this->super_Operation).m_deps.
                                  super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) >> 4);
      lVar8 = lVar8 + 1) {
    RVar4 = tcu::ThreadUtil::Event::waitReady(*(Event **)((long)&pSVar1->m_ptr + lVar7));
    if (RVar4 == RESULT_NOT_READY) {
      bVar6 = false;
    }
    lVar7 = lVar7 + 0x10;
  }
  if (bVar6) {
    if (this->m_useSync != true) {
LAB_00d9ef4a:
      if (bVar6) {
        (*(this->super_Operation)._vptr_Operation[2])(this,thread);
        local_1c8._0_8_ = thread;
        if (this->m_useSync == true) {
          FenceSync::init((this->m_sync).m_ptr,(EVP_PKEY_CTX *)thread);
          std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 8));
          std::operator<<(&local_1b0,"Begin -- glFlush()");
          tcu::ThreadUtil::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c8,(EndToken *)&tcu::ThreadUtil::Message::End);
          std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
          (*thread->gl->flush)();
          GVar5 = (*thread->gl->getError)();
          glu::checkError(GVar5,"flush()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                          ,0x1e7);
          local_1c8._0_8_ = thread;
          std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 8));
          std::operator<<(&local_1b0,"End -- glFlush()");
          tcu::ThreadUtil::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c8,(EndToken *)&tcu::ThreadUtil::Message::End);
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 8));
          std::operator<<(&local_1b0,"Begin -- glFinish()");
          tcu::ThreadUtil::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c8,(EndToken *)&tcu::ThreadUtil::Message::End);
          std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
          (*thread->gl->finish)();
          GVar5 = (*thread->gl->getError)();
          glu::checkError(GVar5,"finish()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                          ,0x1ed);
          local_1c8._0_8_ = thread;
          std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 8));
          std::operator<<(&local_1b0,"End -- glFinish()");
          tcu::ThreadUtil::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c8,(EndToken *)&tcu::ThreadUtil::Message::End);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
      }
      goto LAB_00d9f0c7;
    }
    lVar7 = -1;
    lVar8 = 0;
    do {
      pSVar2 = (this->m_syncDeps).
               super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 1;
      if ((int)((ulong)((long)(this->m_syncDeps).
                              super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) >> 4) <=
          lVar7) goto LAB_00d9ef4a;
      bVar3 = FenceSync::waitReady(*(FenceSync **)((long)&pSVar2->m_ptr + lVar8),thread);
      lVar8 = lVar8 + 0x10;
    } while (bVar3);
  }
  else {
LAB_00d9f0c7:
    if (bVar6) {
      RVar4 = RESULT_OK;
      goto LAB_00d9f0d3;
    }
  }
  RVar4 = RESULT_FAILED;
LAB_00d9f0d3:
  tcu::ThreadUtil::Event::setResult((this->super_Operation).m_event.m_ptr,RVar4);
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::clear(&(this->super_Operation).m_deps);
  local_1c8._0_8_ = (Thread *)0x0;
  local_1c8._8_8_ = (SharedPtrStateBase *)0x0;
  de::SharedPtr<tcu::ThreadUtil::Event>::operator=
            (&(this->super_Operation).m_event,(SharedPtr<tcu::ThreadUtil::Event> *)local_1c8);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr((SharedPtr<tcu::ThreadUtil::Event> *)local_1c8);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::clear(&this->m_syncDeps);
  local_1c8._0_8_ = (Thread *)0x0;
  local_1c8._8_8_ = (SharedPtrStateBase *)0x0;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::operator=
            (&this->m_sync,(SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *)local_1c8);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::release
            ((SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *)local_1c8);
  return;
}

Assistant:

void Operation::execute (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	bool success = true;

	// Wait for dependencies and check that they succeeded
	for (int depNdx = 0; depNdx < (int)m_deps.size(); depNdx++)
	{
		if (!m_deps[depNdx]->waitReady())
			success = false;
	}

	// Try execute operation
	if (success)
	{
		try
		{
			if (m_useSync)
			{
				for (int depNdx = 0; depNdx < (int)m_syncDeps.size(); depNdx++)
				{
					EGLThread* eglThread = dynamic_cast<EGLThread*>(&thread);
					DE_ASSERT(eglThread);
					if (m_syncDeps[depNdx]->waitReady(*eglThread) != tcu::ThreadUtil::Event::RESULT_OK)
					{
						success = false;
						break;
					}
				}
			}

			if (success)
			{
				exec(thread);
				if (m_useSync)
				{
					EGLThread* eglThread = dynamic_cast<EGLThread*>(&thread);
					DE_ASSERT(eglThread);
					m_sync->init(*eglThread, m_serverSync);
					thread.newMessage() << "Begin -- glFlush()" << tcu::ThreadUtil::Message::End;
					GLU_CHECK_GLW_CALL(thread.gl, flush());
					thread.newMessage() << "End -- glFlush()" << tcu::ThreadUtil::Message::End;
				}
				else
				{
					thread.newMessage() << "Begin -- glFinish()" << tcu::ThreadUtil::Message::End;
					GLU_CHECK_GLW_CALL(thread.gl, finish());
					thread.newMessage() << "End -- glFinish()" << tcu::ThreadUtil::Message::End;
				}
			}
		}
		catch (...)
		{
			// Got exception event failed
			m_event->setResult(tcu::ThreadUtil::Event::RESULT_FAILED);
			throw;
		}
	}

	if (success)
		m_event->setResult(tcu::ThreadUtil::Event::RESULT_OK);
	else
		m_event->setResult(tcu::ThreadUtil::Event::RESULT_FAILED);

	m_deps.clear();
	m_event = SharedPtr<tcu::ThreadUtil::Event>();
	m_syncDeps.clear();
	m_sync = SharedPtr<FenceSync>();
}